

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageoutput.cc
# Opt level: O0

unique_ptr<ImageOutput,_std::default_delete<ImageOutput>_> ImageOutput::create(string *filename)

{
  bool bVar1;
  ulong uVar2;
  pointer ppVar3;
  runtime_error *prVar4;
  ImageOutput *this;
  ulong in_RSI;
  __uniq_ptr_data<ImageOutput,_std::default_delete<ImageOutput>,_true,_true> in_RDI;
  undefined1 in_stack_00000028 [16];
  string_view in_stack_00000038;
  const_iterator found;
  Creator createFunction;
  string format;
  unique_ptr<ImageOutput,_std::default_delete<ImageOutput>_> *out;
  pointer in_stack_fffffffffffffdb8;
  string *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  char *local_1c8 [2];
  string local_1b8 [32];
  iterator local_198;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>
  local_190;
  iterator local_188;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>
  local_180;
  _func_ImageOutput_ptr *local_178;
  string local_170 [2];
  string local_130 [32];
  undefined1 local_110 [55];
  byte local_d9;
  ulong local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c8 [3];
  undefined8 local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_a8;
  char *local_a0;
  size_t local_98;
  ulong local_90;
  char *local_88;
  size_t sStack_80;
  string *local_78;
  char *local_70;
  char **local_68;
  char **local_60;
  char *local_58;
  size_t sStack_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_48;
  undefined8 *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_30;
  undefined8 local_28;
  undefined8 *local_20;
  char *local_18;
  char **local_10;
  char *local_8;
  
  local_d9 = 0;
  local_d8 = in_RSI;
  std::unique_ptr<ImageOutput,std::default_delete<ImageOutput>>::
  unique_ptr<std::default_delete<ImageOutput>,void>
            ((unique_ptr<ImageOutput,_std::default_delete<ImageOutput>_> *)in_stack_fffffffffffffdc0
            );
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"ImageOutput::create() called with no filename");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = Imageio::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                   *)0x1d6eec);
  if (bVar1) {
    Imageio::catalogBuiltinPlugins();
    bVar1 = Imageio::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
            ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                     *)0x1d6f05);
    if (bVar1) {
      __assert_fail("!Imageio::outputFormats.empty() && \"No image output plugins compiled in.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/imageoutput.cc"
                    ,0x2b,
                    "static std::unique_ptr<ImageOutput> ImageOutput::create(const std::string &)");
    }
  }
  uVar2 = local_d8;
  std::__cxx11::string::find_last_of((char)local_d8,0x2e);
  std::__cxx11::string::substr((ulong)local_130,uVar2);
  Imageio::string::string(in_stack_fffffffffffffdc0,(string *)in_stack_fffffffffffffdb8);
  std::__cxx11::string::~string(local_130);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    Imageio::string::string(in_stack_fffffffffffffdc0,(string *)in_stack_fffffffffffffdb8);
    Imageio::string::operator=(in_stack_fffffffffffffdc0,(string *)in_stack_fffffffffffffdb8);
    Imageio::string::~string((string *)0x1d6ff9);
  }
  Imageio::string::tolower(local_170,(int)local_110);
  Imageio::string::~string((string *)0x1d705e);
  local_178 = (_func_ImageOutput_ptr *)0x0;
  local_188._M_node =
       (_Base_ptr)
       Imageio::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
               *)in_stack_fffffffffffffdb8,(key_type *)0x1d707e);
  Imageio::std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>
  ::_Rb_tree_const_iterator(&local_180,&local_188);
  local_198._M_node =
       (_Base_ptr)
       Imageio::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
              *)in_stack_fffffffffffffdb8);
  Imageio::std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>
  ::_Rb_tree_const_iterator(&local_190,&local_198);
  bVar1 = Imageio::std::operator!=(&local_180,&local_190);
  if (!bVar1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_68 = local_1c8;
    local_70 = 
    "Could not find a format writer for \"{}\". Is it a file format that we don\'t know about?";
    local_18 = 
    "Could not find a format writer for \"{}\". Is it a file format that we don\'t know about?";
    local_1c8[0] = 
    "Could not find a format writer for \"{}\". Is it a file format that we don\'t know about?";
    local_10 = local_68;
    local_98 = std::char_traits<char>::length((char_type *)0x1d7185);
    local_8 = local_70;
    local_78 = local_1b8;
    local_88 = local_1c8[0];
    local_90 = local_d8;
    local_60 = &local_88;
    local_a0 = local_1c8[0];
    sStack_80 = local_98;
    local_58 = local_a0;
    sStack_50 = local_98;
    local_c8[0] = fmt::v10::
                  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                            (in_stack_fffffffffffffdc8);
    local_40 = &local_b0;
    local_48 = local_c8;
    local_28 = 0xd;
    local_b0 = 0xd;
    local_38 = local_48;
    local_30 = local_48;
    local_20 = local_40;
    local_a8 = local_48;
    fmt::v10::vformat_abi_cxx11_(in_stack_00000038,(format_args)in_stack_00000028);
    std::runtime_error::runtime_error(prVar4,local_1b8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppVar3 = Imageio::std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>
                         *)0x1d70f8);
  local_178 = ppVar3->second;
  if (local_178 != (_func_ImageOutput_ptr *)0x0) {
    this = (*local_178)();
    std::unique_ptr<ImageOutput,std::default_delete<ImageOutput>>::
    unique_ptr<std::default_delete<ImageOutput>,void>
              ((unique_ptr<ImageOutput,_std::default_delete<ImageOutput>_> *)this,
               in_stack_fffffffffffffdb8);
    Imageio::std::unique_ptr<ImageOutput,_std::default_delete<ImageOutput>_>::operator=
              ((unique_ptr<ImageOutput,_std::default_delete<ImageOutput>_> *)this,
               (unique_ptr<ImageOutput,_std::default_delete<ImageOutput>_> *)
               in_stack_fffffffffffffdb8);
    Imageio::std::unique_ptr<ImageOutput,_std::default_delete<ImageOutput>_>::~unique_ptr
              ((unique_ptr<ImageOutput,_std::default_delete<ImageOutput>_> *)this);
    local_d9 = 1;
    Imageio::string::~string((string *)0x1d740a);
    if ((local_d9 & 1) == 0) {
      Imageio::std::unique_ptr<ImageOutput,_std::default_delete<ImageOutput>_>::~unique_ptr
                ((unique_ptr<ImageOutput,_std::default_delete<ImageOutput>_> *)this);
    }
    return (__uniq_ptr_data<ImageOutput,_std::default_delete<ImageOutput>,_true,_true>)
           (tuple<ImageOutput_*,_std::default_delete<ImageOutput>_>)
           in_RDI.super___uniq_ptr_impl<ImageOutput,_std::default_delete<ImageOutput>_>._M_t.
           super__Tuple_impl<0UL,_ImageOutput_*,_std::default_delete<ImageOutput>_>.
           super__Head_base<0UL,_ImageOutput_*,_false>._M_head_impl;
  }
  __assert_fail("createFunction != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/imageoutput.cc"
                ,0x44,"static std::unique_ptr<ImageOutput> ImageOutput::create(const std::string &)"
               );
}

Assistant:

std::unique_ptr<ImageOutput>
ImageOutput::create(const std::string& filename)
{
    std::unique_ptr<ImageOutput> out;
    if (filename.empty()) {  // Can't even guess if no name given
        throw std::runtime_error(
            "ImageOutput::create() called with no filename"
        );
    }

    // Populate outputFormats.
    if (Imageio::outputFormats.empty()) {
        Imageio::catalogBuiltinPlugins();
        assert(!Imageio::outputFormats.empty()
               && "No image output plugins compiled in.");
    }

    // Extract the file extension from the filename (without the leading dot)
    Imageio::string format = filename.substr(filename.find_last_of('.')+1);
    if (format.empty()) {
        // If the file had no extension, maybe it was itself the format name
        format = filename;
    }
    format.tolower();

    ImageOutput::Creator createFunction = nullptr;
    // See if it's already in the table.  If not, scan all plugins we can
    // find to populate the table.
    Imageio::OutputPluginMap::const_iterator found
            = Imageio::outputFormats.find(format);
    if (found != Imageio::outputFormats.end()) {
        createFunction = found->second;
    } else {
        throw std::runtime_error(
            fmt::format("Could not find a format writer for \"{}\". "
                    "Is it a file format that we don't know about?",
                    filename));
    }

    assert(createFunction != nullptr);
    out = std::unique_ptr<ImageOutput>(createFunction());
    return out;
}